

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.h
# Opt level: O1

size_t duckdb_fsst_decompress
                 (duckdb_fsst_decoder_t *decoder,size_t lenIn,uchar *strIn,size_t size,uchar *output
                 )

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  bVar3 = size >= 0x20;
  if (lenIn < 4 || size < 0x20) {
    uVar6 = 0;
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    uVar1 = 4;
    uVar9 = 0;
    do {
      uVar6 = uVar1;
      uVar7 = ~((~*(uint *)(strIn + uVar9) & 0x7f7f7f7f) + 0x7f7f7f7f) & *(uint *)(strIn + uVar9) &
              0x80808080;
      if (uVar7 != 0) {
        uVar4 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        sVar5 = (*(code *)((long)&DAT_01df909c + (long)(int)(&DAT_01df909c)[uVar4 >> 3]))();
        return sVar5;
      }
      bVar2 = strIn[uVar9];
      *(unsigned_long_long *)(output + uVar8) = decoder->symbol[bVar2];
      lVar10 = decoder->len[bVar2] + uVar8;
      bVar2 = strIn[uVar9 + 1];
      *(unsigned_long_long *)(output + lVar10) = decoder->symbol[bVar2];
      lVar10 = (ulong)decoder->len[bVar2] + lVar10;
      bVar2 = strIn[uVar9 + 2];
      *(unsigned_long_long *)(output + lVar10) = decoder->symbol[bVar2];
      lVar10 = (ulong)decoder->len[bVar2] + lVar10;
      bVar2 = strIn[uVar9 + 3];
      *(unsigned_long_long *)(output + lVar10) = decoder->symbol[bVar2];
      uVar8 = (ulong)decoder->len[bVar2] + lVar10;
      bVar3 = uVar8 + 0x20 <= size;
    } while ((uVar6 + 4 <= lenIn) && (uVar1 = uVar6 + 4, uVar9 = uVar6, uVar8 + 0x20 <= size));
  }
  if (bVar3) {
    uVar1 = uVar6 + 2;
    if (uVar1 <= lenIn) {
      output[uVar8] = strIn[uVar6 + 1];
      uVar9 = (ulong)strIn[uVar6];
      if (uVar9 == 0xff) {
        uVar8 = uVar8 + 1;
        uVar6 = uVar1;
      }
      else {
        *(unsigned_long_long *)(output + uVar8) = decoder->symbol[uVar9];
        lVar10 = decoder->len[uVar9] + uVar8;
        uVar8 = (ulong)strIn[uVar6 + 1];
        if (uVar8 == 0xff) {
          output[lVar10] = strIn[uVar6 + 2];
          uVar8 = lVar10 + 1;
          uVar6 = uVar6 + 3;
        }
        else {
          *(unsigned_long_long *)(output + lVar10) = decoder->symbol[uVar8];
          uVar8 = (ulong)decoder->len[uVar8] + lVar10;
          uVar6 = uVar1;
        }
      }
    }
    if (uVar6 < lenIn) {
      bVar2 = strIn[uVar6];
      *(unsigned_long_long *)(output + uVar8) = decoder->symbol[bVar2];
      uVar8 = uVar8 + decoder->len[bVar2];
      uVar6 = uVar6 + 1;
    }
  }
  while (uVar1 = uVar8, uVar6 < lenIn) {
    uVar9 = uVar6 + 1;
    uVar11 = (ulong)strIn[uVar6];
    if (uVar11 == 0xff) {
      if (uVar1 < size) {
        output[uVar1] = strIn[uVar9];
      }
      uVar8 = uVar1 + 1;
      uVar6 = uVar6 + 2;
    }
    else {
      uVar8 = decoder->len[uVar11] + uVar1;
      sVar5 = size;
      if (uVar8 < size) {
        sVar5 = uVar8;
      }
      uVar6 = uVar9;
      if (uVar1 < sVar5) {
        lVar10 = 0;
        do {
          output[lVar10 + uVar1] = *(uchar *)((long)decoder->symbol + lVar10 + uVar11 * 8);
          lVar10 = lVar10 + 1;
        } while (sVar5 - uVar1 != lVar10);
      }
    }
  }
  if ((size <= uVar1) && ((decoder->zeroTerminated & 1) != 0)) {
    output[size - 1] = '\0';
  }
  return uVar1;
}

Assistant:

inline size_t /* OUT: bytesize of the decompressed string. If > size, the decoded output is truncated to size. */
duckdb_fsst_decompress(
   duckdb_fsst_decoder_t *decoder,  /* IN: use this symbol table for compression. */
   size_t lenIn,             /* IN: byte-length of compressed string. */
   const unsigned char *strIn,     /* IN: compressed string. */
   size_t size,              /* IN: byte-length of output buffer. */
   unsigned char *output     /* OUT: memory buffer to put the decompressed string in. */
) {
   unsigned char*__restrict__ len = (unsigned char* __restrict__) decoder->len;
   unsigned char*__restrict__ strOut = (unsigned char* __restrict__) output;
   unsigned long long*__restrict__ symbol = (unsigned long long* __restrict__) decoder->symbol; 
   size_t code, posOut = 0, posIn = 0;
#ifndef FSST_MUST_ALIGN /* defining on platforms that require aligned memory access may help their performance */
#define FSST_UNALIGNED_STORE(dst,src) memcpy((void*) (dst), &(src), sizeof(unsigned long long))
#if defined(__BYTE_ORDER__) && defined(__ORDER_LITTLE_ENDIAN__) && (__BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__)
   while (posOut+32 <= size && posIn+4 <= lenIn) {
      unsigned int nextBlock, escapeMask;
      memcpy(&nextBlock, strIn+posIn, sizeof(unsigned int));
      escapeMask = (nextBlock&0x80808080u)&((((~nextBlock)&0x7F7F7F7Fu)+0x7F7F7F7Fu)^0x80808080u);
      if (escapeMask == 0) {
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
     } else { 
         unsigned long firstEscapePos=static_cast<unsigned long>(__builtin_ctzll((unsigned long long) escapeMask)>>3);
         switch(firstEscapePos) { /* Duff's device */
         case 3: code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code];
			 DUCKDB_FSST_EXPLICIT_FALLTHROUGH;
         case 2: code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code];
			 DUCKDB_FSST_EXPLICIT_FALLTHROUGH;
         case 1: code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code];
			 DUCKDB_FSST_EXPLICIT_FALLTHROUGH;
         case 0: posIn+=2; strOut[posOut++] = strIn[posIn-1]; /* decompress an escaped byte */
         }
      }
   }
   if (posOut+32 <= size) { // handle the possibly 3 last bytes without a loop
      if (posIn+2 <= lenIn) { 
	 strOut[posOut] = strIn[posIn+1]; 
         if (strIn[posIn] != FSST_ESC) {
            code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
            if (strIn[posIn] != FSST_ESC) {
               code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
            } else { 
               posIn += 2; strOut[posOut++] = strIn[posIn-1]; 
            }
         } else {
            posIn += 2; posOut++; 
         } 
      }
      if (posIn < lenIn) { // last code cannot be an escape
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code];
      }
   }
#else
   while (posOut+8 <= size && posIn < lenIn)
      if ((code = strIn[posIn++]) < FSST_ESC) { /* symbol compressed as code? */
         FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); /* unaligned memory write */
         posOut += len[code];
      } else { 
         strOut[posOut] = strIn[posIn]; /* decompress an escaped byte */
         posIn++; posOut++; 
      }
#endif
#endif
   while (posIn < lenIn)
      if ((code = strIn[posIn++]) < FSST_ESC) {
         size_t posWrite = posOut, endWrite = posOut + len[code];
         unsigned char* __restrict__ symbolPointer = ((unsigned char* __restrict__) &symbol[code]) - posWrite;
         if ((posOut = endWrite) > size) endWrite = size;
         for(; posWrite < endWrite; posWrite++)  /* only write if there is room */
            strOut[posWrite] = symbolPointer[posWrite];
      } else {
         if (posOut < size) strOut[posOut] = strIn[posIn]; /* idem */
         posIn++; posOut++; 
      } 
   if (posOut >= size && (decoder->zeroTerminated&1)) strOut[size-1] = 0;
   return posOut; /* full size of decompressed string (could be >size, then the actually decompressed part) */
}